

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu.c
# Opt level: O0

void alloc_read_metadata(AV1Decoder *pbi,OBU_METADATA_TYPE metadata_type,uint8_t *data,size_t sz,
                        aom_metadata_insert_flags_t insert_flag)

{
  aom_metadata_array_t *paVar1;
  aom_metadata_t *paVar2;
  void *pvVar3;
  uint8_t *in_RCX;
  undefined8 in_RDX;
  long in_RDI;
  undefined4 in_R8D;
  aom_metadata_t **metadata_array;
  aom_metadata_t *metadata;
  size_t in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  aom_metadata_insert_flags_t insert_flag_00;
  undefined4 in_stack_ffffffffffffffd8;
  uint32_t type;
  
  type = (uint32_t)((ulong)in_RDX >> 0x20);
  insert_flag_00 = (aom_metadata_insert_flags_t)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  if (*(long *)(in_RDI + 0x5f718) == 0) {
    paVar1 = aom_img_metadata_array_alloc(in_stack_ffffffffffffffc8);
    *(aom_metadata_array_t **)(in_RDI + 0x5f718) = paVar1;
    if (*(long *)(in_RDI + 0x5f718) == 0) {
      aom_internal_error((aom_internal_error_info *)(in_RDI + 0x5ff08),AOM_CODEC_MEM_ERROR,
                         "Failed to allocate metadata array");
    }
  }
  paVar2 = aom_img_metadata_alloc
                     (type,in_RCX,CONCAT44(in_R8D,in_stack_ffffffffffffffd8),insert_flag_00);
  if (paVar2 == (aom_metadata_t *)0x0) {
    aom_internal_error((aom_internal_error_info *)(in_RDI + 0x5ff08),AOM_CODEC_MEM_ERROR,
                       "Error allocating metadata");
  }
  pvVar3 = realloc(*(void **)(*(long *)(in_RDI + 0x5f718) + 8),
                   (**(long **)(in_RDI + 0x5f718) + 1) * 8);
  if (pvVar3 == (void *)0x0) {
    aom_img_metadata_free((aom_metadata_t *)0x1d6f47);
    aom_internal_error((aom_internal_error_info *)(in_RDI + 0x5ff08),AOM_CODEC_MEM_ERROR,
                       "Error growing metadata array");
  }
  *(void **)(*(long *)(in_RDI + 0x5f718) + 8) = pvVar3;
  *(aom_metadata_t **)
   (*(long *)(*(long *)(in_RDI + 0x5f718) + 8) + **(long **)(in_RDI + 0x5f718) * 8) = paVar2;
  **(long **)(in_RDI + 0x5f718) = **(long **)(in_RDI + 0x5f718) + 1;
  return;
}

Assistant:

static void alloc_read_metadata(AV1Decoder *const pbi,
                                OBU_METADATA_TYPE metadata_type,
                                const uint8_t *data, size_t sz,
                                aom_metadata_insert_flags_t insert_flag) {
  if (!pbi->metadata) {
    pbi->metadata = aom_img_metadata_array_alloc(0);
    if (!pbi->metadata) {
      aom_internal_error(&pbi->error, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate metadata array");
    }
  }
  aom_metadata_t *metadata =
      aom_img_metadata_alloc(metadata_type, data, sz, insert_flag);
  if (!metadata) {
    aom_internal_error(&pbi->error, AOM_CODEC_MEM_ERROR,
                       "Error allocating metadata");
  }
  aom_metadata_t **metadata_array =
      (aom_metadata_t **)realloc(pbi->metadata->metadata_array,
                                 (pbi->metadata->sz + 1) * sizeof(metadata));
  if (!metadata_array) {
    aom_img_metadata_free(metadata);
    aom_internal_error(&pbi->error, AOM_CODEC_MEM_ERROR,
                       "Error growing metadata array");
  }
  pbi->metadata->metadata_array = metadata_array;
  pbi->metadata->metadata_array[pbi->metadata->sz] = metadata;
  pbi->metadata->sz++;
}